

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall Database::ExecuteFile(Database *this,string *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  _Node *p_Var4;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _List_node_base *this_00;
  char *p;
  _List_node_base *this_01;
  string query;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  char buf [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1050;
  char local_1038 [4104];
  
  local_1050._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1050;
  local_1050._M_impl._M_node._M_size = 0;
  local_1070._M_dataplus._M_p = (pointer)&local_1070.field_2;
  local_1070._M_string_length = 0;
  local_1070.field_2._M_local_buf[0] = '\0';
  local_1050._M_impl._M_node.super__List_node_base._M_prev =
       local_1050._M_impl._M_node.super__List_node_base._M_next;
  __stream = fopen((filename->_M_dataplus)._M_p,"rt");
  pcVar3 = fgets(local_1038,0x1000,__stream);
  if (pcVar3 == (char *)0x0) {
LAB_001309eb:
    fclose(__stream);
    p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        &local_1050,&local_1070);
    __it._M_node = (_List_node_base *)&local_1050;
    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    local_1050._M_impl._M_node._M_size = local_1050._M_impl._M_node._M_size + 1;
    local_1070._M_string_length = 0;
    *local_1070._M_dataplus._M_p = '\0';
    this_01 = local_1050._M_impl._M_node.super__List_node_base._M_next;
    while ((this_01 != (_List_node_base *)&local_1050 &&
           (bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::$_0>::operator()
                              ((_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0>
                                *)this_01,__it), !bVar1))) {
      this_01 = this_01->_M_next;
    }
    if (this_01 != (_List_node_base *)&local_1050) {
      for (this_00 = this_01->_M_next; this_00 != (_List_node_base *)&local_1050;
          this_00 = this_00->_M_next) {
        bVar1 = __gnu_cxx::__ops::
                _Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::$_0>::operator()
                          ((_Iter_pred<Database::ExecuteFile(std::__cxx11::string_const&)::__0> *)
                           this_00,__it);
        if (!bVar1) {
          __it._M_node = this_00 + 1;
          std::__cxx11::string::operator=((string *)(this_01 + 1),(string *)__it._M_node);
          this_01 = this_01->_M_next;
        }
      }
    }
    ExecuteQueries<std::_List_iterator<std::__cxx11::string>>
              (this,(_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )local_1050._M_impl._M_node.super__List_node_base._M_next,
               (_List_node_base *)&local_1050);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1070._M_dataplus._M_p != &local_1070.field_2) {
      operator_delete(local_1070._M_dataplus._M_p,
                      CONCAT71(local_1070.field_2._M_allocated_capacity._1_7_,
                               local_1070.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_1050);
    return;
  }
LAB_0013097c:
  iVar2 = feof(__stream);
  pcVar3 = local_1038;
  if (iVar2 == 0) {
    do {
      if (*pcVar3 == ';') {
        p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            &local_1050,&local_1070);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        local_1050._M_impl._M_node._M_size = local_1050._M_impl._M_node._M_size + 1;
        local_1070._M_string_length = 0;
        *local_1070._M_dataplus._M_p = '\0';
      }
      else {
        if (*pcVar3 == '\0') goto LAB_001309d6;
        std::__cxx11::string::push_back((char)&local_1070);
      }
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  goto LAB_001309eb;
LAB_001309d6:
  pcVar3 = fgets(local_1038,0x1000,__stream);
  if (pcVar3 == (char *)0x0) goto LAB_001309eb;
  goto LAB_0013097c;
}

Assistant:

void Database::ExecuteFile(const std::string& filename)
{
	std::list<std::string> queries;
	std::string query;

	FILE* fh = std::fopen(filename.c_str(), "rt");

	try
	{
		while (true)
		{
			char buf[4096];

			const char *result = std::fgets(buf, 4096, fh);

			if (!result || std::feof(fh))
				break;

			for (char* p = buf; *p != '\0'; ++p)
			{
				if (*p == ';')
				{
					queries.push_back(query);
					query.erase();
				}
				else
				{
					query += *p;
				}
			}
		}
	}
	catch (std::exception &e)
	{
		std::fclose(fh);
		throw;
	}

	std::fclose(fh);

	queries.push_back(query);
	query.erase();

	std::remove_if(UTIL_RANGE(queries), [&](const std::string& s) { return util::trim(s).length() == 0; });

	this->ExecuteQueries(UTIL_RANGE(queries));
}